

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ScratchFree(void *p)

{
  int iVar1;
  _func_void_sqlite3_mutex_ptr **pp_Var2;
  sqlite3_mutex *psVar3;
  
  if (p != (void *)0x0) {
    if ((p < sqlite3Config.pScratch) || (mem0.pScratchEnd <= p)) {
      if (sqlite3Config.bMemstat == 0) {
        pp_Var2 = (_func_void_sqlite3_mutex_ptr **)&sqlite3Config.m.xFree;
        goto LAB_001f875c;
      }
      iVar1 = (*sqlite3Config.m.xSize)(p);
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
      }
      sqlite3Stat.nowValue[4] = sqlite3Stat.nowValue[4] - iVar1;
      sqlite3Stat.nowValue[0] = sqlite3Stat.nowValue[0] - iVar1;
      sqlite3Stat.nowValue[9] = sqlite3Stat.nowValue[9] + -1;
      (*sqlite3Config.m.xFree)(p);
      psVar3 = mem0.mutex;
    }
    else {
      if (mem0.mutex == (sqlite3_mutex *)0x0) {
        psVar3 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
        psVar3 = mem0.mutex;
      }
      *(ScratchFreeslot **)p = mem0.pScratchFree;
      mem0.nScratchFree = mem0.nScratchFree + 1;
      sqlite3Stat.nowValue[3] = sqlite3Stat.nowValue[3] + -1;
      mem0.pScratchFree = (ScratchFreeslot *)p;
    }
    if (psVar3 != (sqlite3_mutex *)0x0) {
      pp_Var2 = &sqlite3Config.mutex.xMutexLeave;
      p = psVar3;
LAB_001f875c:
      (**pp_Var2)((sqlite3_mutex *)p);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ScratchFree(void *p){
  if( p ){

#if SQLITE_THREADSAFE==0 && !defined(NDEBUG)
    /* Verify that no more than two scratch allocation per thread
    ** is outstanding at one time.  (This is only checked in the
    ** single-threaded case since checking in the multi-threaded case
    ** would be much more complicated.) */
    assert( scratchAllocOut>=1 && scratchAllocOut<=2 );
    scratchAllocOut--;
#endif

    if( SQLITE_WITHIN(p, sqlite3GlobalConfig.pScratch, mem0.pScratchEnd) ){
      /* Release memory from the SQLITE_CONFIG_SCRATCH allocation */
      ScratchFreeslot *pSlot;
      pSlot = (ScratchFreeslot*)p;
      sqlite3_mutex_enter(mem0.mutex);
      pSlot->pNext = mem0.pScratchFree;
      mem0.pScratchFree = pSlot;
      mem0.nScratchFree++;
      assert( mem0.nScratchFree <= (u32)sqlite3GlobalConfig.nScratch );
      sqlite3StatusDown(SQLITE_STATUS_SCRATCH_USED, 1);
      sqlite3_mutex_leave(mem0.mutex);
    }else{
      /* Release memory back to the heap */
      assert( sqlite3MemdebugHasType(p, MEMTYPE_SCRATCH) );
      assert( sqlite3MemdebugNoType(p, (u8)~MEMTYPE_SCRATCH) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      if( sqlite3GlobalConfig.bMemstat ){
        int iSize = sqlite3MallocSize(p);
        sqlite3_mutex_enter(mem0.mutex);
        sqlite3StatusDown(SQLITE_STATUS_SCRATCH_OVERFLOW, iSize);
        sqlite3StatusDown(SQLITE_STATUS_MEMORY_USED, iSize);
        sqlite3StatusDown(SQLITE_STATUS_MALLOC_COUNT, 1);
        sqlite3GlobalConfig.m.xFree(p);
        sqlite3_mutex_leave(mem0.mutex);
      }else{
        sqlite3GlobalConfig.m.xFree(p);
      }
    }
  }
}